

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::add_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  SmallVector<unsigned_int,_8UL> *this_00;
  uint32_t *puVar1;
  uint uVar2;
  TypeID id;
  Variant *pVVar3;
  size_t sVar4;
  CompilerGLSL *pCVar5;
  BuiltIn BVar6;
  CompilerMSL *this_01;
  SPIRFunction *pSVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  uint32_t uVar13;
  ExecutionModel EVar14;
  uint32_t uVar15;
  SPIRType *type;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *this_02;
  SPIRType *type_00;
  ulong uVar16;
  SPIRConstant *pSVar17;
  undefined7 extraout_var;
  runtime_error *prVar18;
  uint *ts_1;
  undefined8 unaff_RBP;
  ulong uVar19;
  SPIRVariable *pSVar20;
  ID IVar21;
  BuiltIn builtin;
  InterfaceBlockMeta *local_258;
  SPIRType *local_250;
  uint local_248;
  undefined4 local_244;
  uint32_t var_mbr_idx;
  uint32_t location;
  string *local_238;
  SPIRType *local_230;
  uint32_t local_224;
  CompilerMSL *local_220;
  uint32_t initializer;
  undefined4 uStack_214;
  undefined1 local_208 [16];
  uint *local_1f8;
  SPIRVariable *local_1f0;
  uint local_1e4;
  uint32_t ptr_type_id;
  undefined4 uStack_1dc;
  char local_1d0 [16];
  SPIRFunction *local_1c0;
  string mbr_name_qual;
  SPIRType ptr_type;
  
  pSVar20 = var;
  local_238 = ib_var_ref;
  local_230 = ib_type;
  local_1c0 = Variant::get<spirv_cross::SPIRFunction>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr +
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  local_258 = meta;
  if (meta->strip_array == true) {
    type = Compiler::get_variable_element_type((Compiler *)this,var);
  }
  else {
    type = Compiler::get_variable_data_type((Compiler *)this,var);
  }
  bVar8 = Compiler::is_builtin_variable((Compiler *)this,var);
  builtin = Compiler::get_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  bVar9 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock);
  if ((storage == StorageClassOutput) &&
     (bVar10 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,var), bVar10)
     ) {
    emit_local_masked_variable(this,var,local_258->strip_array);
    return;
  }
  if ((storage == StorageClassInput) &&
     (bVar10 = Compiler::has_decoration
                         ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPerVertexKHR)
     , bVar10)) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    ptr_type.super_IVariant._vptr_IVariant = (_func_int **)&ptr_type.width;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&ptr_type,"PerVertexKHR decoration is not supported in MSL.","");
    ::std::runtime_error::runtime_error(prVar18,(string *)&ptr_type);
    *(undefined ***)prVar18 = &PTR__runtime_error_003d7e38;
    __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
  if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    bVar10 = variable_storage_requires_stage_io(this,storage);
    if ((!bVar10) && (bVar9)) {
      bVar10 = (type->array).super_VectorView<unsigned_int>.buffer_size == 0;
    }
    if (bVar8 || bVar10 != true) {
      uVar19 = 0;
    }
    else {
      uVar19 = CONCAT71((int7)((ulong)unaff_RBP >> 8),local_258->allow_local_declaration);
    }
    if ((char)uVar19 != '\0') {
      emit_local_masked_variable(this,var,local_258->strip_array);
    }
    if (bVar10 == false) {
LAB_002a23a0:
      add_plain_variable_to_interface_block(this,storage,local_238,local_230,var,local_258);
      return;
    }
    location = 0xffffffff;
    var_mbr_idx = 0;
    bVar8 = Compiler::is_matrix((Compiler *)this,type);
    bVar10 = Compiler::is_array((Compiler *)this,type);
    if (bVar8) {
      if (bVar10) {
        prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
        ptr_type.super_IVariant._vptr_IVariant = (_func_int **)&ptr_type.width;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&ptr_type,
                   "MSL cannot emit arrays-of-matrices in input and output variables.","");
        ::std::runtime_error::runtime_error(prVar18,(string *)&ptr_type);
        *(undefined ***)prVar18 = &PTR__runtime_error_003d7e38;
        __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_224 = type->columns;
    }
    else {
      local_224 = 1;
      if (bVar10) {
        if ((type->array).super_VectorView<unsigned_int>.buffer_size != 1) {
          prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
          ptr_type.super_IVariant._vptr_IVariant = (_func_int **)&ptr_type.width;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&ptr_type,
                     "MSL cannot emit arrays-of-arrays in input and output variables.","");
          ::std::runtime_error::runtime_error(prVar18,(string *)&ptr_type);
          *(undefined ***)prVar18 = &PTR__runtime_error_003d7e38;
          __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_224 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type);
      }
    }
    local_248 = 0;
    local_250 = type;
    local_220 = this;
    if (local_224 == 0) {
      bVar12 = 1;
    }
    else {
      local_1e4 = (uint)uVar19;
      pCVar5 = &this->super_CompilerGLSL;
      this_02 = &local_1c0->local_variables;
      this_00 = &this->vars_needing_early_declaration;
      local_1f8 = (uint *)0x0;
      local_1f0 = var;
      do {
        if ((int)(type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                 .buffer_size != 0) {
          uVar19 = 0;
          do {
            builtin = BuiltInMax;
            uVar13 = (uint32_t)uVar19;
            bVar8 = Compiler::is_member_builtin((Compiler *)this,type,uVar13,&builtin);
            type_00 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 (type->member_types).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                                 [uVar19].id);
            if ((storage == StorageClassOutput) &&
               (bVar10 = CompilerGLSL::is_stage_output_block_member_masked
                                   (&this->super_CompilerGLSL,var,uVar13,local_258->strip_array),
               bVar10)) {
              location = 0xffffffff;
              local_1f8 = (uint *)((ulong)local_1f8 & 0xff);
              if (bVar9) {
                local_1f8 = (uint *)0x1;
              }
              type = local_250;
              if ((bVar8) && (local_258->strip_array == false)) {
                uVar13 = ParsedIR::increase_bound_by(&(pCVar5->super_Compiler).ir,2);
                ptr_type_id = uVar13;
                SPIRType::SPIRType(&ptr_type,type_00);
                ptr_type.pointer = true;
                ptr_type.pointer_depth = ptr_type.pointer_depth + 1;
                ptr_type.parent_type.id =
                     (local_250->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar19].id;
                ptr_type.storage = StorageClassOutput;
                initializer = 0;
                uVar16 = (ulong)(var->initializer).id;
                if (uVar16 != 0) {
                  if ((uVar16 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.buffer_size) &&
                     (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr,
                     pVVar3[uVar16].type == TypeConstant)) {
                    pSVar17 = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + uVar16);
                  }
                  else {
                    pSVar17 = (SPIRConstant *)0x0;
                  }
                  if (pSVar17 != (SPIRConstant *)0x0) {
                    initializer = (pSVar17->subconstants).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                                  [uVar19].id;
                  }
                }
                Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                          ((Compiler *)this,ptr_type_id,&ptr_type);
                IVar21.id = uVar13 + 1;
                mbr_name_qual._M_dataplus._M_p._0_4_ = 3;
                pSVar20 = (SPIRVariable *)&initializer;
                Compiler::
                set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,unsigned_int&>
                          ((Compiler *)this,IVar21.id,&ptr_type_id,(StorageClass *)&mbr_name_qual,
                           (uint *)pSVar20);
                pSVar7 = local_1c0;
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                          (this_02,(local_1c0->local_variables).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
                                   buffer_size + 1);
                sVar4 = (pSVar7->local_variables).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
                (pSVar7->local_variables).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr[sVar4].id =
                     IVar21.id;
                (pSVar7->local_variables).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size =
                     sVar4 + 1;
                SmallVector<unsigned_int,_8UL>::reserve
                          (this_00,(this->vars_needing_early_declaration).
                                   super_VectorView<unsigned_int>.buffer_size + 1);
                sVar4 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.
                        buffer_size;
                (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr[sVar4] =
                     IVar21.id;
                (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size =
                     sVar4 + 1;
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                          (&mbr_name_qual,this,(ulong)builtin,3);
                Compiler::set_name((Compiler *)this,IVar21,&mbr_name_qual);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)mbr_name_qual._M_dataplus._M_p != &mbr_name_qual.field_2) {
                  operator_delete(mbr_name_qual._M_dataplus._M_p);
                }
                Compiler::set_decoration((Compiler *)this,IVar21,DecorationBuiltIn,builtin);
                ptr_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_003d8230;
                ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::~_Hashtable(&ptr_type.member_name_cache._M_h);
                ptr_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size =
                     0;
                if ((AlignedBuffer<unsigned_int,_8UL> *)
                    ptr_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
                    &ptr_type.member_type_index_redirection.stack_storage) {
                  free(ptr_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
                }
                type = local_250;
                ptr_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                .buffer_size = 0;
                if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                    ptr_type.member_types.
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
                    &ptr_type.member_types.stack_storage) {
                  free(ptr_type.member_types.
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
                }
                ptr_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
                if ((AlignedBuffer<bool,_8UL> *)
                    ptr_type.array_size_literal.super_VectorView<bool>.ptr !=
                    &ptr_type.array_size_literal.stack_storage) {
                  free(ptr_type.array_size_literal.super_VectorView<bool>.ptr);
                }
                ptr_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
                if ((AlignedBuffer<unsigned_int,_8UL> *)
                    ptr_type.array.super_VectorView<unsigned_int>.ptr !=
                    &ptr_type.array.stack_storage) {
                  free(ptr_type.array.super_VectorView<unsigned_int>.ptr);
                }
              }
            }
            else if ((!bVar8) ||
                    (bVar10 = Compiler::has_active_builtin((Compiler *)this,builtin,storage),
                    type = local_250, bVar10)) {
              bVar10 = Compiler::is_matrix((Compiler *)this,type_00);
              if ((bVar10) || (bVar10 = Compiler::is_array((Compiler *)this,type_00), bVar10)) {
                local_244 = 0;
              }
              else {
                local_244 = (undefined4)
                            CONCAT71(extraout_var,
                                     *(int *)&(type_00->super_IVariant).field_0xc != 0xf);
              }
              bVar10 = true;
              if (storage == StorageClassInput) {
                EVar14 = Compiler::get_execution_model((Compiler *)this);
                bVar10 = EVar14 == ExecutionModelFragment;
              }
              bVar11 = variable_storage_requires_stage_io(this,storage);
              BVar6 = builtin;
              ts_1 = (uint *)0x1;
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&ptr_type,this,(ulong)(local_1f0->super_IVariant).self.id);
              mbr_name_qual._M_dataplus._M_p = (pointer)&mbr_name_qual.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&mbr_name_qual,ptr_type.super_IVariant._vptr_IVariant,
                         ptr_type.super_IVariant._8_8_ +
                         (long)ptr_type.super_IVariant._vptr_IVariant);
              _ptr_type_id = local_1d0;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&ptr_type_id,ptr_type.super_IVariant._vptr_IVariant,
                         ptr_type.super_IVariant._8_8_ +
                         (long)ptr_type.super_IVariant._vptr_IVariant);
              if (local_224 != 1) {
                join<char_const(&)[2],unsigned_int&>
                          ((string *)&initializer,(spirv_cross *)0x34c680,(char (*) [2])&local_248,
                           ts_1);
                ::std::__cxx11::string::_M_append
                          ((char *)&mbr_name_qual,CONCAT44(uStack_214,initializer));
                if ((undefined1 *)CONCAT44(uStack_214,initializer) != local_208) {
                  operator_delete((undefined1 *)CONCAT44(uStack_214,initializer));
                }
                join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                          ((string *)&initializer,(spirv_cross *)0x3464bc,(char (*) [2])&local_248,
                           (uint *)0x33ea72,(char (*) [2])pSVar20);
                ::std::__cxx11::string::_M_append
                          ((char *)&ptr_type_id,CONCAT44(uStack_214,initializer));
                if ((undefined1 *)CONCAT44(uStack_214,initializer) != local_208) {
                  operator_delete((undefined1 *)CONCAT44(uStack_214,initializer));
                }
              }
              var = local_1f0;
              this = local_220;
              type = local_250;
              pSVar20 = local_1f0;
              if (((~bVar11 | (byte)local_244) & 1) == 0 &&
                  (bVar8 & bVar10 & BVar6 - BuiltInVertexId < 0xfffffffe) == 0) {
                add_composite_member_variable_to_interface_block
                          (local_220,storage,local_238,local_230,local_1f0,local_250,uVar13,
                           local_258,&mbr_name_qual,(string *)&ptr_type_id,&location,&var_mbr_idx);
              }
              else {
                add_plain_member_variable_to_interface_block
                          (local_220,storage,local_238,local_230,local_1f0,local_250,uVar13,
                           local_258,&mbr_name_qual,(string *)&ptr_type_id,&location,&var_mbr_idx);
              }
              if (_ptr_type_id != local_1d0) {
                operator_delete(_ptr_type_id);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)mbr_name_qual._M_dataplus._M_p != &mbr_name_qual.field_2) {
                operator_delete(mbr_name_qual._M_dataplus._M_p);
              }
              if (ptr_type.super_IVariant._vptr_IVariant != (_func_int **)&ptr_type.width) {
                operator_delete(ptr_type.super_IVariant._vptr_IVariant);
              }
            }
            var_mbr_idx = var_mbr_idx + 1;
            uVar19 = uVar19 + 1;
          } while (uVar19 < (uint)(type->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                  buffer_size);
        }
        local_248 = local_248 + 1;
      } while (local_248 < local_224);
      bVar12 = (byte)local_1f8 ^ 1;
      uVar19 = (ulong)local_1e4;
    }
    if (((((byte)uVar19 | bVar12) & 1) == 0) &&
       ((bVar8 = Compiler::is_builtin_variable((Compiler *)this,var), !bVar8 ||
        (EVar14 = Compiler::get_execution_model((Compiler *)this),
        EVar14 == ExecutionModelTessellationControl)))) {
      bVar8 = Compiler::is_builtin_variable((Compiler *)this,var);
      this_01 = local_220;
      if (bVar8) {
        if ((int)(type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                 .buffer_size != 0) {
          uVar13 = 0;
          do {
            id.id = (type->super_IVariant).self.id;
            uVar15 = Compiler::get_member_decoration
                               ((Compiler *)this_01,id,uVar13,DecorationBuiltIn);
            (*(this_01->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&ptr_type,this_01,(ulong)uVar15,3);
            Compiler::set_member_name((Compiler *)this_01,id,uVar13,(string *)&ptr_type);
            if (ptr_type.super_IVariant._vptr_IVariant != (_func_int **)&ptr_type.width) {
              operator_delete(ptr_type.super_IVariant._vptr_IVariant);
            }
            uVar13 = uVar13 + 1;
            type = local_250;
          } while (uVar13 < (uint)(local_250->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                  buffer_size);
        }
        IVar21.id = (type->super_IVariant).self.id;
        puVar1 = &ptr_type.width;
        ptr_type.super_IVariant._vptr_IVariant = (_func_int **)puVar1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&ptr_type,"gl_PerVertex","");
        this = local_220;
        Compiler::set_name((Compiler *)local_220,IVar21,(string *)&ptr_type);
        if (ptr_type.super_IVariant._vptr_IVariant != (_func_int **)puVar1) {
          operator_delete(ptr_type.super_IVariant._vptr_IVariant);
        }
        IVar21.id = (var->super_IVariant).self.id;
        ptr_type.super_IVariant._vptr_IVariant = (_func_int **)puVar1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&ptr_type,"gl_out_masked","");
        Compiler::set_name((Compiler *)this,IVar21,(string *)&ptr_type);
        if (ptr_type.super_IVariant._vptr_IVariant != (_func_int **)puVar1) {
          operator_delete(ptr_type.super_IVariant._vptr_IVariant);
        }
        (this->stage_out_masked_builtin_type_id).id = (local_250->super_IVariant).self.id;
      }
      emit_local_masked_variable(this,var,local_258->strip_array);
    }
  }
  else {
    EVar14 = Compiler::get_execution_model((Compiler *)this);
    if ((((EVar14 == ExecutionModelTessellationEvaluation && storage == StorageClassInput) &&
         (bVar8)) && (local_258->strip_array == false)) && (builtin - BuiltInTessLevelOuter < 2)) {
      add_tess_level_input_to_interface_block(this,local_238,local_230,var);
      return;
    }
    uVar2 = *(uint *)&(type->super_IVariant).field_0xc;
    if (((uVar2 < 0x18) && ((0x8077fcU >> (uVar2 & 0x1f) & 1) != 0)) &&
       ((!bVar8 || (bVar9 = Compiler::has_active_builtin((Compiler *)this,builtin,storage), bVar9)))
       ) {
      bVar9 = Compiler::is_matrix((Compiler *)this,type);
      if (bVar9) {
        bVar9 = false;
      }
      else {
        bVar9 = Compiler::is_array((Compiler *)this,type);
        bVar9 = !bVar9;
      }
      bVar10 = variable_storage_requires_stage_io(this,storage);
      bVar11 = true;
      if (storage == StorageClassInput) {
        EVar14 = Compiler::get_execution_model((Compiler *)this);
        bVar11 = EVar14 == ExecutionModelFragment;
      }
      if ((!bVar9 && bVar10) && (bVar8 & bVar11 & builtin - BuiltInVertexId < 0xfffffffe) == 0) {
        add_composite_variable_to_interface_block(this,storage,local_238,local_230,var,local_258);
        return;
      }
      goto LAB_002a23a0;
    }
  }
  return;
}

Assistant:

void CompilerMSL::add_variable_to_interface_block(StorageClass storage, const string &ib_var_ref, SPIRType &ib_type,
                                                  SPIRVariable &var, InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	// Tessellation control I/O variables and tessellation evaluation per-point inputs are
	// usually declared as arrays. In these cases, we want to add the element type to the
	// interface block, since in Metal it's the interface block itself which is arrayed.
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	bool is_builtin = is_builtin_variable(var);
	auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_block = has_decoration(var_type.self, DecorationBlock);

	// If stage variables are masked out, emit them as plain variables instead.
	// For builtins, we query them one by one later.
	// IO blocks are not masked here, we need to mask them per-member instead.
	if (storage == StorageClassOutput && is_stage_output_variable_masked(var))
	{
		// If we ignore an output, we must still emit it, since it might be used by app.
		// Instead, just emit it as early declaration.
		emit_local_masked_variable(var, meta.strip_array);
		return;
	}

	if (storage == StorageClassInput && has_decoration(var.self, DecorationPerVertexKHR))
		SPIRV_CROSS_THROW("PerVertexKHR decoration is not supported in MSL.");

	// If variable names alias, they will end up with wrong names in the interface struct, because
	// there might be aliases in the member name cache and there would be a mismatch in fixup_in code.
	// Make sure to register the variables as unique resource names ahead of time.
	// This would normally conflict with the name cache when emitting local variables,
	// but this happens in the setup stage, before we hit compilation loops.
	// The name cache is cleared before we actually emit code, so this is safe.
	add_resource_name(var.self);

	if (var_type.basetype == SPIRType::Struct)
	{
		bool block_requires_flattening =
		    variable_storage_requires_stage_io(storage) || (is_block && var_type.array.empty());
		bool needs_local_declaration = !is_builtin && block_requires_flattening && meta.allow_local_declaration;

		if (needs_local_declaration)
		{
			// For I/O blocks or structs, we will need to pass the block itself around
			// to functions if they are used globally in leaf functions.
			// Rather than passing down member by member,
			// we unflatten I/O blocks while running the shader,
			// and pass the actual struct type down to leaf functions.
			// We then unflatten inputs, and flatten outputs in the "fixup" stages.
			emit_local_masked_variable(var, meta.strip_array);
		}

		if (!block_requires_flattening)
		{
			// In Metal tessellation shaders, the interface block itself is arrayed. This makes things
			// very complicated, since stage-in structures in MSL don't support nested structures.
			// Luckily, for stage-out when capturing output, we can avoid this and just add
			// composite members directly, because the stage-out structure is stored to a buffer,
			// not returned.
			add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
		}
		else
		{
			bool masked_block = false;
			uint32_t location = UINT32_MAX;
			uint32_t var_mbr_idx = 0;
			uint32_t elem_cnt = 1;
			if (is_matrix(var_type))
			{
				if (is_array(var_type))
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

				elem_cnt = var_type.columns;
			}
			else if (is_array(var_type))
			{
				if (var_type.array.size() != 1)
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

				elem_cnt = to_array_size_literal(var_type);
			}

			for (uint32_t elem_idx = 0; elem_idx < elem_cnt; elem_idx++)
			{
				// Flatten the struct members into the interface struct
				for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
				{
					builtin = BuiltInMax;
					is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
					auto &mbr_type = get<SPIRType>(var_type.member_types[mbr_idx]);

					if (storage == StorageClassOutput && is_stage_output_block_member_masked(var, mbr_idx, meta.strip_array))
					{
						location = UINT32_MAX; // Skip this member and resolve location again on next var member

						if (is_block)
							masked_block = true;

						// Non-builtin block output variables are just ignored, since they will still access
						// the block variable as-is. They're just not flattened.
						if (is_builtin && !meta.strip_array)
						{
							// Emit a fake variable instead.
							uint32_t ids = ir.increase_bound_by(2);
							uint32_t ptr_type_id = ids + 0;
							uint32_t var_id = ids + 1;

							auto ptr_type = mbr_type;
							ptr_type.pointer = true;
							ptr_type.pointer_depth++;
							ptr_type.parent_type = var_type.member_types[mbr_idx];
							ptr_type.storage = StorageClassOutput;

							uint32_t initializer = 0;
							if (var.initializer)
								if (auto *c = maybe_get<SPIRConstant>(var.initializer))
									initializer = c->subconstants[mbr_idx];

							set<SPIRType>(ptr_type_id, ptr_type);
							set<SPIRVariable>(var_id, ptr_type_id, StorageClassOutput, initializer);
							entry_func.add_local_variable(var_id);
							vars_needing_early_declaration.push_back(var_id);
							set_name(var_id, builtin_to_glsl(builtin, StorageClassOutput));
							set_decoration(var_id, DecorationBuiltIn, builtin);
						}
					}
					else if (!is_builtin || has_active_builtin(builtin, storage))
					{
						bool is_composite_type = is_matrix(mbr_type) || is_array(mbr_type) || mbr_type.basetype == SPIRType::Struct;
						bool attribute_load_store =
								storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;
						bool storage_is_stage_io = variable_storage_requires_stage_io(storage);

						// Clip/CullDistance always need to be declared as user attributes.
						if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
							is_builtin = false;

						const string var_name = to_name(var.self);
						string mbr_name_qual = var_name;
						string var_chain_qual = var_name;
						if (elem_cnt > 1)
						{
							mbr_name_qual += join("_", elem_idx);
							var_chain_qual += join("[", elem_idx, "]");
						}

						if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
						{
							add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                                 var, var_type, mbr_idx, meta,
							                                                 mbr_name_qual, var_chain_qual,
							                                                 location, var_mbr_idx);
						}
						else
						{
							add_plain_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                             var, var_type, mbr_idx, meta,
							                                             mbr_name_qual, var_chain_qual,
							                                             location, var_mbr_idx);
						}
					}
					var_mbr_idx++;
				}
			}

			// If we're redirecting a block, we might still need to access the original block
			// variable if we're masking some members.
			if (masked_block && !needs_local_declaration && (!is_builtin_variable(var) || is_tesc_shader()))
			{
				if (is_builtin_variable(var))
				{
					// Ensure correct names for the block members if we're actually going to
					// declare gl_PerVertex.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
					{
						set_member_name(var_type.self, mbr_idx, builtin_to_glsl(
								BuiltIn(get_member_decoration(var_type.self, mbr_idx, DecorationBuiltIn)),
								StorageClassOutput));
					}

					set_name(var_type.self, "gl_PerVertex");
					set_name(var.self, "gl_out_masked");
					stage_out_masked_builtin_type_id = var_type.self;
				}
				emit_local_masked_variable(var, meta.strip_array);
			}
		}
	}
	else if (is_tese_shader() && storage == StorageClassInput && !meta.strip_array && is_builtin &&
	         (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner))
	{
		add_tess_level_input_to_interface_block(ib_var_ref, ib_type, var);
	}
	else if (var_type.basetype == SPIRType::Boolean || var_type.basetype == SPIRType::Char ||
	         type_is_integral(var_type) || type_is_floating_point(var_type))
	{
		if (!is_builtin || has_active_builtin(builtin, storage))
		{
			bool is_composite_type = is_matrix(var_type) || is_array(var_type);
			bool storage_is_stage_io = variable_storage_requires_stage_io(storage);
			bool attribute_load_store = storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;

			// Clip/CullDistance always needs to be declared as user attributes.
			if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
				is_builtin = false;

			// MSL does not allow matrices or arrays in input or output variables, so need to handle it specially.
			if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
			{
				add_composite_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
			else
			{
				add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
		}
	}
}